

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  int in_EDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float next_split;
  int i;
  float prev_split;
  float w_items;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  float *in_stack_ffffffffffffffb8;
  ImVector<float> *in_stack_ffffffffffffffc0;
  ImVector<float> *this;
  int local_2c;
  float local_28;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  ImVector<float>::push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  fVar3 = -(pIVar2->Style).ItemInnerSpacing.x * (float)(in_EDI + -1) + in_XMM0_Da;
  local_28 = fVar3;
  for (local_2c = in_EDI + -1; 0 < local_2c; local_2c = local_2c + -1) {
    fVar4 = (float)(int)((fVar3 * (float)local_2c) / (float)in_EDI);
    this = &(pIVar1->DC).ItemWidthStack;
    ImMax<float>(local_28 - fVar4,1.0);
    ImVector<float>::push_back(this,in_stack_ffffffffffffffb8);
    local_28 = fVar4;
  }
  fVar3 = ImMax<float>(local_28,1.0);
  (pIVar1->DC).ItemWidth = fVar3;
  (pIVar2->NextItemData).Flags = (pIVar2->NextItemData).Flags & 0xfffffffe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(components > 0);
    const ImGuiStyle& style = g.Style;
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    float w_items = w_full - style.ItemInnerSpacing.x * (components - 1);
    float prev_split = w_items;
    for (int i = components - 1; i > 0; i--)
    {
        float next_split = IM_TRUNC(w_items * i / components);
        window->DC.ItemWidthStack.push_back(ImMax(prev_split - next_split, 1.0f));
        prev_split = next_split;
    }
    window->DC.ItemWidth = ImMax(prev_split, 1.0f);
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}